

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alsa.cpp
# Opt level: O3

int __thiscall
anon_unknown.dwarf_254152::AlsaCapture::open(AlsaCapture *this,char *__file,int __oflag,...)

{
  snd_pcm_t **ppsVar1;
  uint uVar2;
  ALCdevice *pAVar3;
  pointer pDVar4;
  code *pcVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  char *pcVar10;
  backend_exception *pbVar11;
  undefined8 uVar12;
  uint uVar13;
  pointer __old_p;
  pointer pDVar14;
  undefined4 uVar15;
  long lVar16;
  RingBuffer *pRVar17;
  snd_pcm_t *psVar18;
  pointer pDVar19;
  long lVar20;
  snd_pcm_uframes_t periodSizeInFrames;
  snd_pcm_hw_params_t *hp;
  snd_pcm_uframes_t bufferSizeInFrames;
  ulong local_70;
  vector<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_> local_68
  ;
  AlsaCapture *local_50;
  vector<DevMap> local_48;
  
  if (__file == (char *)0x0) {
    pcVar10 = GetConfigValue((char *)0x0,"alsa","capture","default");
    __file = "ALSA Default";
  }
  else {
    local_50 = this;
    if ((anonymous_namespace)::CaptureDevices._M_i == DAT_0022d2b8._M_i) {
      probe_devices(&local_48,SND_PCM_STREAM_CAPTURE);
      local_68.
      super__Vector_base<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = DAT_0022d2c0;
      local_68.
      super__Vector_base<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)DAT_0022d2b8._M_i;
      local_68.
      super__Vector_base<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)(anonymous_namespace)::CaptureDevices._M_i;
      DAT_0022d2c0 = local_48.
                     super__Vector_base<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
      (anonymous_namespace)::CaptureDevices._M_i =
           (__int_type_conflict2)
           local_48.
           super__Vector_base<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>
           ._M_impl.super__Vector_impl_data._M_start;
      DAT_0022d2b8._M_i =
           (__int_type_conflict2)
           local_48.
           super__Vector_base<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_48.
      super__Vector_base<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_48.
      super__Vector_base<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_48.
      super__Vector_base<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>
      ::~vector(&local_68);
      std::vector<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>
      ::~vector(&local_48);
    }
    pDVar4 = (pointer)DAT_0022d2b8._M_i;
    lVar20 = DAT_0022d2b8._M_i - (anonymous_namespace)::CaptureDevices._M_i;
    pDVar14 = (pointer)(anonymous_namespace)::CaptureDevices._M_i;
    if (0 < lVar20 >> 8) {
      lVar16 = (lVar20 >> 8) + 1;
      do {
        iVar6 = std::__cxx11::string::compare((char *)pDVar14);
        pDVar19 = pDVar14;
        if (iVar6 == 0) goto LAB_001625a0;
        iVar6 = std::__cxx11::string::compare((char *)(pDVar14 + 1));
        pDVar19 = pDVar14 + 1;
        if (iVar6 == 0) goto LAB_001625a0;
        iVar6 = std::__cxx11::string::compare((char *)(pDVar14 + 2));
        pDVar19 = pDVar14 + 2;
        if (iVar6 == 0) goto LAB_001625a0;
        iVar6 = std::__cxx11::string::compare((char *)(pDVar14 + 3));
        pDVar19 = pDVar14 + 3;
        if (iVar6 == 0) goto LAB_001625a0;
        pDVar14 = pDVar14 + 4;
        lVar16 = lVar16 + -1;
        lVar20 = lVar20 + -0x100;
      } while (1 < lVar16);
    }
    lVar20 = lVar20 >> 6;
    if (lVar20 == 1) {
LAB_0016255f:
      iVar6 = std::__cxx11::string::compare((char *)pDVar14);
      pDVar19 = pDVar4;
      if (iVar6 == 0) {
        pDVar19 = pDVar14;
      }
    }
    else if (lVar20 == 2) {
LAB_0016254c:
      iVar6 = std::__cxx11::string::compare((char *)pDVar14);
      pDVar19 = pDVar14;
      if (iVar6 != 0) {
        pDVar14 = pDVar14 + 1;
        goto LAB_0016255f;
      }
    }
    else {
      pDVar19 = pDVar4;
      if ((lVar20 == 3) &&
         (iVar6 = std::__cxx11::string::compare((char *)pDVar14), pDVar19 = pDVar14, iVar6 != 0)) {
        pDVar14 = pDVar14 + 1;
        goto LAB_0016254c;
      }
    }
LAB_001625a0:
    if (pDVar19 == (pointer)DAT_0022d2b8._M_i) {
      pbVar11 = (backend_exception *)__cxa_allocate_exception(0x30);
      al::backend_exception::backend_exception(pbVar11,0xa004,"Device name \"%s\" not found",__file)
      ;
      __cxa_throw(pbVar11,&al::backend_exception::typeinfo,al::base_exception::~base_exception);
    }
    pcVar10 = (pDVar19->device_name)._M_dataplus._M_p;
    this = local_50;
  }
  if (2 < (int)gLogLevel) {
    fprintf((FILE *)gLogFile,"[ALSOFT] (II) Opening device \"%s\"\n",pcVar10);
  }
  ppsVar1 = &this->mPcmHandle;
  iVar6 = (*(anonymous_namespace)::psnd_pcm_open)(ppsVar1,pcVar10,1,1);
  if (iVar6 < 0) {
    pbVar11 = (backend_exception *)__cxa_allocate_exception(0x30);
    al::backend_exception::backend_exception
              (pbVar11,0xa005,"Could not open ALSA device \"%s\"",pcVar10);
    __cxa_throw(pbVar11,&al::backend_exception::typeinfo,al::base_exception::~base_exception);
  }
  (*(anonymous_namespace)::psnd_config_update_free_global)();
  pAVar3 = (this->super_BackendBase).mDevice;
  uVar15 = 0xffffffff;
  if ((ulong)pAVar3->FmtType < 7) {
    uVar15 = *(undefined4 *)(&DAT_00192f40 + (ulong)pAVar3->FmtType * 4);
  }
  uVar2 = pAVar3->BufferSize;
  uVar13 = pAVar3->Frequency * 100;
  local_48.
  super__Vector_base<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)((ulong)uVar13 / 1000);
  if (uVar13 / 1000 < uVar2) {
    local_48.
    super__Vector_base<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)(ulong)uVar2;
  }
  uVar13 = (pAVar3->Frequency * 0x19) / 1000;
  if (uVar2 < uVar13) {
    uVar13 = uVar2;
  }
  local_70 = (ulong)uVar13;
  local_68.
  super__Vector_base<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (*(anonymous_namespace)::psnd_pcm_hw_params_malloc)(&local_68);
  pDVar4 = local_68.
           super__Vector_base<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>
           ._M_impl.super__Vector_impl_data._M_start;
  iVar6 = (*(anonymous_namespace)::psnd_pcm_hw_params_any)
                    (*ppsVar1,local_68.
                              super__Vector_base<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>
                              ._M_impl.super__Vector_impl_data._M_start);
  if (iVar6 < 0) {
    pbVar11 = (backend_exception *)__cxa_allocate_exception(0x30);
    uVar12 = (*(anonymous_namespace)::psnd_strerror)(iVar6);
    al::backend_exception::backend_exception
              (pbVar11,0xa004,"snd_pcm_hw_params_any(mPcmHandle, hp.get()) failed: %s",uVar12);
  }
  else {
    iVar6 = (*(anonymous_namespace)::psnd_pcm_hw_params_set_access)(*ppsVar1,pDVar4,3);
    if (iVar6 < 0) {
      pbVar11 = (backend_exception *)__cxa_allocate_exception(0x30);
      uVar12 = (*(anonymous_namespace)::psnd_strerror)(iVar6);
      al::backend_exception::backend_exception
                (pbVar11,0xa004,
                 "snd_pcm_hw_params_set_access(mPcmHandle, hp.get(), SND_PCM_ACCESS_RW_INTERLEAVED) failed: %s"
                 ,uVar12);
    }
    else {
      iVar6 = (*(anonymous_namespace)::psnd_pcm_hw_params_set_format)(*ppsVar1,pDVar4,uVar15);
      pcVar5 = (anonymous_namespace)::psnd_pcm_hw_params_set_channels;
      if (iVar6 < 0) {
        pbVar11 = (backend_exception *)__cxa_allocate_exception(0x30);
        uVar12 = (*(anonymous_namespace)::psnd_strerror)(iVar6);
        al::backend_exception::backend_exception
                  (pbVar11,0xa004,
                   "snd_pcm_hw_params_set_format(mPcmHandle, hp.get(), format) failed: %s",uVar12);
      }
      else {
        pAVar3 = (this->super_BackendBase).mDevice;
        psVar18 = this->mPcmHandle;
        uVar7 = ChannelsFromDevFmt(pAVar3->FmtChans,pAVar3->mAmbiOrder);
        iVar6 = (*pcVar5)(psVar18,pDVar4,uVar7);
        if (iVar6 < 0) {
          pbVar11 = (backend_exception *)__cxa_allocate_exception(0x30);
          uVar12 = (*(anonymous_namespace)::psnd_strerror)(iVar6);
          al::backend_exception::backend_exception
                    (pbVar11,0xa004,
                     "snd_pcm_hw_params_set_channels(mPcmHandle, hp.get(), mDevice->channelsFromFmt()) failed: %s"
                     ,uVar12);
        }
        else {
          iVar6 = (*(anonymous_namespace)::psnd_pcm_hw_params_set_rate)
                            (this->mPcmHandle,pDVar4,((this->super_BackendBase).mDevice)->Frequency)
          ;
          if (iVar6 < 0) {
            pbVar11 = (backend_exception *)__cxa_allocate_exception(0x30);
            uVar12 = (*(anonymous_namespace)::psnd_strerror)(iVar6);
            al::backend_exception::backend_exception
                      (pbVar11,0xa004,
                       "snd_pcm_hw_params_set_rate(mPcmHandle, hp.get(), mDevice->Frequency, 0) failed: %s"
                       ,uVar12);
          }
          else {
            psVar18 = *ppsVar1;
            pRVar17 = (RingBuffer *)pDVar4;
            iVar6 = (*(anonymous_namespace)::psnd_pcm_hw_params_set_buffer_size_min)
                              (psVar18,pDVar4,&local_48);
            if (iVar6 < 0) {
              if (2 < (int)gLogLevel) {
                _GLOBAL__N_1::AlsaCapture::open((char *)psVar18,(int)pRVar17);
              }
              iVar8 = (*(anonymous_namespace)::psnd_pcm_hw_params_set_buffer_size_near)
                                (*ppsVar1,pDVar4,&local_48);
              if (iVar8 < 0) {
                pbVar11 = (backend_exception *)__cxa_allocate_exception(0x30);
                uVar12 = (*(anonymous_namespace)::psnd_strerror)(iVar8);
                al::backend_exception::backend_exception
                          (pbVar11,0xa004,
                           "snd_pcm_hw_params_set_buffer_size_near(mPcmHandle, hp.get(), &bufferSizeInFrames) failed: %s"
                           ,uVar12);
                goto LAB_00162acb;
              }
            }
            iVar8 = (*(anonymous_namespace)::psnd_pcm_hw_params_set_period_size_near)
                              (*ppsVar1,pDVar4,&local_70);
            if (iVar8 < 0) {
              pbVar11 = (backend_exception *)__cxa_allocate_exception(0x30);
              uVar12 = (*(anonymous_namespace)::psnd_strerror)(iVar8);
              al::backend_exception::backend_exception
                        (pbVar11,0xa004,
                         "snd_pcm_hw_params_set_period_size_near(mPcmHandle, hp.get(), &periodSizeInFrames, nullptr) failed: %s"
                         ,uVar12);
            }
            else {
              iVar8 = (*(anonymous_namespace)::psnd_pcm_hw_params)(*ppsVar1,pDVar4);
              if (iVar8 < 0) {
                pbVar11 = (backend_exception *)__cxa_allocate_exception(0x30);
                uVar12 = (*(anonymous_namespace)::psnd_strerror)(iVar8);
                al::backend_exception::backend_exception
                          (pbVar11,0xa004,"snd_pcm_hw_params(mPcmHandle, hp.get()) failed: %s",
                           uVar12);
              }
              else {
                iVar8 = (*(anonymous_namespace)::psnd_pcm_hw_params_get_period_size)
                                  (pDVar4,&local_70,0);
                if (-1 < iVar8) {
                  if ((RingBuffer *)pDVar4 != (RingBuffer *)0x0) {
                    (*(anonymous_namespace)::psnd_pcm_hw_params_free)(pDVar4);
                  }
                  if (iVar6 < 0) {
                    pAVar3 = (this->super_BackendBase).mDevice;
                    uVar2 = pAVar3->BufferSize;
                    uVar7 = BytesFromDevFmt(pAVar3->FmtType);
                    uVar9 = ChannelsFromDevFmt(pAVar3->FmtChans,pAVar3->mAmbiOrder);
                    RingBuffer::Create((RingBuffer *)&local_68,(ulong)uVar2,(ulong)(uVar7 * uVar9),0
                                      );
                    pDVar4 = local_68.
                             super__Vector_base<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>
                             ._M_impl.super__Vector_impl_data._M_start;
                    local_68.
                    super__Vector_base<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>
                    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                    pRVar17 = (this->mRing)._M_t.
                              super___uniq_ptr_impl<RingBuffer,_std::default_delete<RingBuffer>_>.
                              _M_t.
                              super__Tuple_impl<0UL,_RingBuffer_*,_std::default_delete<RingBuffer>_>
                              .super__Head_base<0UL,_RingBuffer_*,_false>._M_head_impl;
                    (this->mRing)._M_t.
                    super___uniq_ptr_impl<RingBuffer,_std::default_delete<RingBuffer>_>._M_t.
                    super__Tuple_impl<0UL,_RingBuffer_*,_std::default_delete<RingBuffer>_>.
                    super__Head_base<0UL,_RingBuffer_*,_false>._M_head_impl = (RingBuffer *)pDVar4;
                    if ((pRVar17 != (RingBuffer *)0x0) &&
                       (al_free(pRVar17),
                       (RingBuffer *)
                       local_68.
                       super__Vector_base<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>
                       ._M_impl.super__Vector_impl_data._M_start != (RingBuffer *)0x0)) {
                      al_free(local_68.
                              super__Vector_base<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>
                              ._M_impl.super__Vector_impl_data._M_start);
                    }
                  }
                  pAVar3 = (this->super_BackendBase).mDevice;
                  pcVar10 = (char *)(pAVar3->DeviceName)._M_string_length;
                  strlen(__file);
                  iVar6 = std::__cxx11::string::_M_replace
                                    ((ulong)&pAVar3->DeviceName,0,pcVar10,(ulong)__file);
                  return iVar6;
                }
                pbVar11 = (backend_exception *)__cxa_allocate_exception(0x30);
                uVar12 = (*(anonymous_namespace)::psnd_strerror)(iVar8);
                al::backend_exception::backend_exception
                          (pbVar11,0xa004,
                           "snd_pcm_hw_params_get_period_size(hp.get(), &periodSizeInFrames, nullptr) failed: %s"
                           ,uVar12);
              }
            }
          }
        }
      }
    }
  }
LAB_00162acb:
  __cxa_throw(pbVar11,&al::backend_exception::typeinfo,al::base_exception::~base_exception);
}

Assistant:

void AlsaCapture::open(const ALCchar *name)
{
    const char *driver{};
    if(name)
    {
        if(CaptureDevices.empty())
            CaptureDevices = probe_devices(SND_PCM_STREAM_CAPTURE);

        auto iter = std::find_if(CaptureDevices.cbegin(), CaptureDevices.cend(),
            [name](const DevMap &entry) -> bool
            { return entry.name == name; }
        );
        if(iter == CaptureDevices.cend())
            throw al::backend_exception{ALC_INVALID_VALUE, "Device name \"%s\" not found", name};
        driver = iter->device_name.c_str();
    }
    else
    {
        name = alsaDevice;
        driver = GetConfigValue(nullptr, "alsa", "capture", "default");
    }

    TRACE("Opening device \"%s\"\n", driver);
    int err{snd_pcm_open(&mPcmHandle, driver, SND_PCM_STREAM_CAPTURE, SND_PCM_NONBLOCK)};
    if(err < 0)
        throw al::backend_exception{ALC_OUT_OF_MEMORY, "Could not open ALSA device \"%s\"",
            driver};

    /* Free alsa's global config tree. Otherwise valgrind reports a ton of leaks. */
    snd_config_update_free_global();

    snd_pcm_format_t format{SND_PCM_FORMAT_UNKNOWN};
    switch(mDevice->FmtType)
    {
    case DevFmtByte:
        format = SND_PCM_FORMAT_S8;
        break;
    case DevFmtUByte:
        format = SND_PCM_FORMAT_U8;
        break;
    case DevFmtShort:
        format = SND_PCM_FORMAT_S16;
        break;
    case DevFmtUShort:
        format = SND_PCM_FORMAT_U16;
        break;
    case DevFmtInt:
        format = SND_PCM_FORMAT_S32;
        break;
    case DevFmtUInt:
        format = SND_PCM_FORMAT_U32;
        break;
    case DevFmtFloat:
        format = SND_PCM_FORMAT_FLOAT;
        break;
    }

    snd_pcm_uframes_t bufferSizeInFrames{maxu(mDevice->BufferSize, 100*mDevice->Frequency/1000)};
    snd_pcm_uframes_t periodSizeInFrames{minu(mDevice->BufferSize, 25*mDevice->Frequency/1000)};

    bool needring{false};
    HwParamsPtr hp{CreateHwParams()};
#define CHECK(x) do {                                                         \
    if((err=(x)) < 0)                                                         \
        throw al::backend_exception{ALC_INVALID_VALUE, #x " failed: %s", snd_strerror(err)}; \
} while(0)
    CHECK(snd_pcm_hw_params_any(mPcmHandle, hp.get()));
    /* set interleaved access */
    CHECK(snd_pcm_hw_params_set_access(mPcmHandle, hp.get(), SND_PCM_ACCESS_RW_INTERLEAVED));
    /* set format (implicitly sets sample bits) */
    CHECK(snd_pcm_hw_params_set_format(mPcmHandle, hp.get(), format));
    /* set channels (implicitly sets frame bits) */
    CHECK(snd_pcm_hw_params_set_channels(mPcmHandle, hp.get(), mDevice->channelsFromFmt()));
    /* set rate (implicitly constrains period/buffer parameters) */
    CHECK(snd_pcm_hw_params_set_rate(mPcmHandle, hp.get(), mDevice->Frequency, 0));
    /* set buffer size in frame units (implicitly sets period size/bytes/time and buffer time/bytes) */
    if(snd_pcm_hw_params_set_buffer_size_min(mPcmHandle, hp.get(), &bufferSizeInFrames) < 0)
    {
        TRACE("Buffer too large, using intermediate ring buffer\n");
        needring = true;
        CHECK(snd_pcm_hw_params_set_buffer_size_near(mPcmHandle, hp.get(), &bufferSizeInFrames));
    }
    /* set buffer size in frame units (implicitly sets period size/bytes/time and buffer time/bytes) */
    CHECK(snd_pcm_hw_params_set_period_size_near(mPcmHandle, hp.get(), &periodSizeInFrames, nullptr));
    /* install and prepare hardware configuration */
    CHECK(snd_pcm_hw_params(mPcmHandle, hp.get()));
    /* retrieve configuration info */
    CHECK(snd_pcm_hw_params_get_period_size(hp.get(), &periodSizeInFrames, nullptr));
#undef CHECK
    hp = nullptr;

    if(needring)
        mRing = RingBuffer::Create(mDevice->BufferSize, mDevice->frameSizeFromFmt(), false);

    mDevice->DeviceName = name;
}